

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  Mat *this_00;
  size_t sVar1;
  int j_2;
  int iVar2;
  uint _w;
  long lVar3;
  long lVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  pointer pMVar8;
  ulong uVar9;
  ulong uVar10;
  int i_4;
  int iVar11;
  int i_3;
  ulong uVar12;
  long lVar13;
  pointer pMVar14;
  ulong uVar15;
  void *pvVar16;
  int *piVar17;
  ulong uVar18;
  int j_3;
  int iVar19;
  int j;
  long lVar20;
  ulong uVar21;
  float sum;
  float fVar22;
  float fVar23;
  float fVar24;
  void *local_268;
  long *local_258;
  long local_238;
  int local_22c;
  long local_228;
  int local_220;
  long local_210;
  long local_208;
  int *local_1f0;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  pointer local_88;
  pointer local_80;
  Mat local_78;
  
  if (this->int8_scale_term != 0) {
    iVar2 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar2;
  }
  local_80 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  lVar3 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)local_80;
  pMVar8 = local_80;
  if (lVar3 == 0x48) {
    iVar2 = this->attn_mask;
    pMVar14 = local_80;
LAB_004b6140:
    local_88 = pMVar14;
    if (iVar2 == 0) {
      local_268 = (void *)0x0;
      piVar17 = (int *)0x0;
      local_238 = 0;
      local_258 = (long *)0x0;
      local_22c = 0;
      iVar2 = 0;
      local_228 = 0;
      goto LAB_004b61e4;
    }
  }
  else {
    iVar2 = this->attn_mask;
    pMVar14 = local_80 + 1;
    local_88 = local_80;
    if (iVar2 == 0 || lVar3 != 0x90) {
      pMVar8 = pMVar14;
      if (iVar2 == 0) {
        pMVar8 = local_80 + 2;
      }
      if (lVar3 != 0xd8) {
        pMVar8 = local_80 + 2;
      }
      if (lVar3 == 0x90) {
        pMVar8 = pMVar14;
      }
      goto LAB_004b6140;
    }
  }
  local_268 = *(void **)((long)local_80 + lVar3 + -0x48);
  piVar17 = *(int **)((long)local_80 + lVar3 + -0x40);
  local_238 = *(long *)((long)local_80 + lVar3 + -0x38);
  local_258 = *(long **)((long)local_80 + lVar3 + -0x28);
  local_22c = *(int *)((long)local_80 + lVar3 + -0x20);
  iVar2 = *(int *)((long)local_80 + lVar3 + -0x1c);
  local_228 = *(long *)((long)local_80 + lVar3 + -8);
  if (piVar17 == (int *)0x0) {
    piVar17 = (int *)0x0;
  }
  else {
    LOCK();
    *piVar17 = *piVar17 + 1;
    UNLOCK();
  }
LAB_004b61e4:
  local_1f0 = &this->attn_mask;
  _h = local_80->h;
  uVar12 = (ulong)_h;
  _h_00 = local_88->h;
  uVar9 = (long)this->embed_dim / (long)this->num_heads;
  _w = this->weight_data_size / this->embed_dim;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w,_h,4,opt->blob_allocator);
  local_220 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    iVar19 = (int)uVar9;
    Mat::create(&local_f8,iVar19,_h,this->num_heads,4,opt->workspace_allocator);
    local_220 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      local_148.cstep = 0;
      local_148.data = (void *)0x0;
      local_148.refcount._0_4_ = 0;
      local_148.refcount._4_4_ = 0;
      local_148.elemsize._0_4_ = 0;
      local_148.elemsize._4_4_ = 0;
      local_148.elempack = 0;
      local_148.allocator = (Allocator *)0x0;
      local_148.dims = 0;
      local_148.w = 0;
      local_148.h = 0;
      local_148.d = 0;
      local_148.c = 0;
      Mat::create(&local_148,iVar19,_h_00,this->num_heads,4,opt->workspace_allocator);
      local_220 = -100;
      if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
        Mat::create(&local_198,_h_00,iVar19,this->num_heads,4,opt->workspace_allocator);
        local_220 = -100;
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
          local_1e8.cstep = 0;
          local_1e8.data = (void *)0x0;
          local_1e8.refcount._0_4_ = 0;
          local_1e8.refcount._4_4_ = 0;
          local_1e8.elemsize._0_4_ = 0;
          local_1e8.elemsize._4_4_ = 0;
          local_1e8.elempack = 0;
          local_1e8.allocator = (Allocator *)0x0;
          local_1e8.dims = 0;
          local_1e8.w = 0;
          local_1e8.h = 0;
          local_1e8.d = 0;
          local_1e8.c = 0;
          Mat::create(&local_1e8,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
          local_220 = -100;
          if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
            local_78.cstep = 0;
            local_78.data = (void *)0x0;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.elemsize._0_4_ = 0;
            local_78.elemsize._4_4_ = 0;
            local_78.elempack = 0;
            local_78.allocator = (Allocator *)0x0;
            local_78.dims = 0;
            local_78.w = 0;
            local_78.h = 0;
            local_78.d = 0;
            local_78.c = 0;
            Mat::create(&local_78,iVar19,this->num_heads,_h,4,opt->workspace_allocator);
            local_220 = -100;
            if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
              uVar18 = 0;
              if (0 < (int)_w) {
                uVar18 = (ulong)_w;
              }
              uVar21 = 0;
              if (0 < iVar19) {
                uVar21 = uVar9 & 0xffffffff;
              }
              if ((int)_h < 1) {
                uVar12 = 0;
              }
              local_208 = 0;
              uVar9 = (ulong)_h_00;
              if ((int)_h_00 < 1) {
                uVar9 = 0;
              }
              local_a0 = (long)iVar19;
              local_a8 = local_a0 * (int)_w * 4;
              local_b0 = local_a0 * 4;
              local_98 = iVar2 * local_238;
              local_210 = 0;
              for (lVar3 = 0; lVar3 < this->num_heads; lVar3 = lVar3 + 1) {
                lVar4 = lVar3 * local_a0;
                for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
                  pvVar6 = (this->q_bias_data).data;
                  lVar13 = (long)(this->q_weight_data).data + local_210;
                  for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
                    fVar22 = *(float *)((long)pvVar6 + (uVar15 + lVar4) * 4);
                    for (lVar20 = 0; (int)uVar18 != (int)lVar20; lVar20 = lVar20 + 1) {
                      fVar22 = fVar22 + *(float *)(lVar13 + lVar20 * 4) *
                                        *(float *)((long)local_80->data +
                                                  lVar20 * 4 +
                                                  local_80->elemsize * uVar10 * (long)local_80->w);
                    }
                    *(float *)((long)local_f8.data +
                              uVar15 * 4 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) *
                              uVar10 + local_f8.cstep * lVar3 *
                                       CONCAT44(local_f8.elemsize._4_4_,
                                                (undefined4)local_f8.elemsize)) =
                         fVar22 * this->scale;
                    lVar13 = lVar13 + (long)(int)_w * 4;
                  }
                }
                for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                  iVar2 = this->kdim;
                  pvVar6 = (this->k_bias_data).data;
                  iVar19 = 0;
                  if (0 < iVar2) {
                    iVar19 = iVar2;
                  }
                  pvVar16 = (void *)(local_208 * iVar2 + (long)(this->k_weight_data).data);
                  for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
                    fVar22 = *(float *)((long)pvVar6 + (uVar15 + lVar4) * 4);
                    for (lVar13 = 0; iVar19 != (int)lVar13; lVar13 = lVar13 + 1) {
                      fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar13 * 4) *
                                        *(float *)((long)local_88->data +
                                                  lVar13 * 4 +
                                                  local_88->elemsize * uVar10 * (long)local_88->w);
                    }
                    *(float *)((long)local_148.data +
                              uVar15 * 4 +
                              (long)local_148.w *
                              CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                              uVar10 + local_148.cstep * lVar3 *
                                       CONCAT44(local_148.elemsize._4_4_,
                                                (undefined4)local_148.elemsize)) = fVar22;
                    pvVar16 = (void *)((long)pvVar16 + (long)iVar2 * 4);
                  }
                }
                lVar13 = local_208;
                for (uVar10 = 0; uVar10 != uVar21; uVar10 = uVar10 + 1) {
                  iVar2 = this->vdim;
                  pvVar6 = (this->v_bias_data).data;
                  iVar19 = 0;
                  if (0 < iVar2) {
                    iVar19 = iVar2;
                  }
                  pvVar16 = (this->v_weight_data).data;
                  for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
                    fVar22 = *(float *)((long)pvVar6 + (uVar10 + lVar4) * 4);
                    for (lVar20 = 0; iVar19 != (int)lVar20; lVar20 = lVar20 + 1) {
                      fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar20 * 4 + iVar2 * lVar13) *
                                        *(float *)((long)pMVar8->data +
                                                  lVar20 * 4 +
                                                  pMVar8->elemsize * uVar15 * (long)pMVar8->w);
                    }
                    *(float *)((long)local_198.data +
                              uVar15 * 4 +
                              (long)local_198.w *
                              CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) *
                              uVar10 + local_198.cstep * lVar3 *
                                       CONCAT44(local_198.elemsize._4_4_,
                                                (undefined4)local_198.elemsize)) = fVar22;
                  }
                  lVar13 = lVar13 + 4;
                }
                pvVar6 = (void *)(CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) *
                                  local_f8.cstep * lVar3 + (long)local_f8.data);
                for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
                  pvVar16 = (void *)(local_148.cstep *
                                     CONCAT44(local_148.elemsize._4_4_,
                                              (undefined4)local_148.elemsize) * lVar3 +
                                    (long)local_148.data);
                  for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
                    fVar22 = 0.0;
                    for (lVar4 = 0; (int)uVar21 != (int)lVar4; lVar4 = lVar4 + 1) {
                      fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar4 * 4) *
                                        *(float *)((long)pvVar6 + lVar4 * 4);
                    }
                    *(float *)((long)local_1e8.data +
                              uVar15 * 4 +
                              (long)local_1e8.w *
                              CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) *
                              uVar10 + local_1e8.cstep * lVar3 *
                                       CONCAT44(local_1e8.elemsize._4_4_,
                                                (undefined4)local_1e8.elemsize)) = fVar22;
                    pvVar16 = (void *)((long)pvVar16 +
                                      (long)local_148.w *
                                      CONCAT44(local_148.elemsize._4_4_,
                                               (undefined4)local_148.elemsize));
                  }
                  pvVar6 = (void *)((long)pvVar6 +
                                   (long)local_f8.w *
                                   CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
                }
                if (*local_1f0 != 0) {
                  if (local_22c == 3) {
                    piVar5 = (int *)0x0;
                    pvVar6 = (void *)(local_228 * local_238 * lVar3 + (long)local_268);
                  }
                  else {
                    pvVar6 = local_268;
                    if (piVar17 == (int *)0x0) {
                      piVar5 = (int *)0x0;
                    }
                    else {
                      LOCK();
                      *piVar17 = *piVar17 + 1;
                      UNLOCK();
                      piVar5 = piVar17;
                    }
                  }
                  pvVar7 = (void *)(CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize
                                            ) * local_1e8.cstep * lVar3 + (long)local_1e8.data);
                  pvVar16 = pvVar6;
                  for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
                    for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                      *(float *)((long)pvVar7 + uVar15 * 4) =
                           *(float *)((long)pvVar7 + uVar15 * 4) +
                           *(float *)((long)pvVar16 + uVar15 * 4);
                    }
                    pvVar7 = (void *)((long)pvVar7 +
                                     (long)local_1e8.w *
                                     CONCAT44(local_1e8.elemsize._4_4_,
                                              (undefined4)local_1e8.elemsize));
                    pvVar16 = (void *)((long)pvVar16 + local_98);
                  }
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_258 == (long *)0x0) {
                        free(pvVar6);
                      }
                      else {
                        (**(code **)(*local_258 + 0x18))();
                      }
                    }
                  }
                }
                local_90 = (long)local_1e8.w *
                           CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                pvVar6 = (void *)(CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)
                                  * local_1e8.cstep * lVar3 + (long)local_1e8.data);
                for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
                  fVar22 = -3.4028235e+38;
                  for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                    fVar24 = *(float *)((long)pvVar6 + uVar15 * 4);
                    if (fVar22 <= fVar24) {
                      fVar22 = fVar24;
                    }
                  }
                  fVar24 = 0.0;
                  for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                    fVar23 = expf(*(float *)((long)pvVar6 + uVar15 * 4) - fVar22);
                    *(float *)((long)pvVar6 + uVar15 * 4) = fVar23;
                    fVar24 = fVar24 + fVar23;
                  }
                  for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                    *(float *)((long)pvVar6 + uVar15 * 4) =
                         *(float *)((long)pvVar6 + uVar15 * 4) * (1.0 / fVar24);
                  }
                  pvVar6 = (void *)((long)pvVar6 + local_90);
                }
                pvVar6 = (void *)(local_1e8.cstep *
                                  CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)
                                  * lVar3 + (long)local_1e8.data);
                for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
                  pvVar16 = (void *)(local_198.cstep *
                                     CONCAT44(local_198.elemsize._4_4_,
                                              (undefined4)local_198.elemsize) * lVar3 +
                                    (long)local_198.data);
                  for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
                    fVar22 = 0.0;
                    for (lVar4 = 0; (int)uVar9 != (int)lVar4; lVar4 = lVar4 + 1) {
                      fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar4 * 4) *
                                        *(float *)((long)pvVar6 + lVar4 * 4);
                    }
                    *(float *)((long)local_78.data +
                              uVar15 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              uVar10 + local_78.w * lVar3 *
                                       CONCAT44(local_78.elemsize._4_4_,
                                                (undefined4)local_78.elemsize)) = fVar22;
                    pvVar16 = (void *)((long)pvVar16 +
                                      (long)local_198.w *
                                      CONCAT44(local_198.elemsize._4_4_,
                                               (undefined4)local_198.elemsize));
                  }
                  pvVar6 = (void *)((long)pvVar6 +
                                   (long)local_1e8.w *
                                   CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)
                                   );
                }
                local_210 = local_210 + local_a8;
                local_208 = local_208 + local_b0;
              }
              local_220 = 0;
              for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
                iVar2 = this_00->w;
                sVar1 = this_00->elemsize;
                pvVar6 = this_00->data;
                pvVar16 = (this->out_weight_data).data;
                iVar19 = this->embed_dim;
                iVar11 = 0;
                if (0 < iVar19) {
                  iVar11 = iVar19;
                }
                pvVar7 = (this->out_bias_data).data;
                for (uVar21 = 0; uVar21 != uVar18; uVar21 = uVar21 + 1) {
                  fVar22 = *(float *)((long)pvVar7 + uVar21 * 4);
                  for (lVar3 = 0; iVar11 != (int)lVar3; lVar3 = lVar3 + 1) {
                    fVar22 = fVar22 + *(float *)((long)pvVar16 + lVar3 * 4) *
                                      *(float *)((long)local_78.data +
                                                lVar3 * 4 +
                                                local_78.cstep *
                                                CONCAT44(local_78.elemsize._4_4_,
                                                         (undefined4)local_78.elemsize) * uVar9);
                  }
                  *(float *)((long)pvVar6 + uVar21 * 4 + (long)iVar2 * uVar9 * sVar1) = fVar22;
                  pvVar16 = (void *)((long)pvVar16 + (long)iVar19 * 4);
                }
              }
            }
            piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_78.allocator == (Allocator *)0x0) {
                  free(local_78.data);
                }
                else {
                  (*(local_78.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_1e8.allocator == (Allocator *)0x0) {
                free(local_1e8.data);
              }
              else {
                (*(local_1e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_198.allocator == (Allocator *)0x0) {
              free(local_198.data);
            }
            else {
              (*(local_198.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            free(local_148.data);
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          free(local_f8.data);
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_258 == (long *)0x0) {
        free(local_268);
      }
      else {
        (**(code **)(*local_258 + 0x18))(local_258,local_268);
      }
    }
  }
  return local_220;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * scale;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}